

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,
          InterpreterStackFrame *newInstance,ScriptContext *scriptContext,bool fromLoopBody,
          Var *registerSaves,BailOutReturnValue *bailOutReturnValue,Var *pArgumentsObject,
          Var branchValue,void *returnAddress,bool useStartCall,void *argoutRestoreAddress)

{
  GlobalBailOutRecordDataTable *pGVar1;
  StackLiteralBailOutRecord *pSVar2;
  code *pcVar3;
  bool bVar4;
  RegNum RVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  LocalFunctionId LVar9;
  RegSlot RVar10;
  undefined4 *puVar11;
  Var aValue;
  DynamicObject *this_00;
  FunctionBody *pFVar12;
  ArgOutOffsetInfo *pAVar13;
  ulong uVar14;
  GlobalBailOutRecordDataRow *pGVar15;
  ulong uVar16;
  uint i;
  uint uVar17;
  uint uVar18;
  uint outParamSlot;
  Var *ppvVar19;
  
  scriptContext->firstInterpreterFrameReturnAddress = returnAddress;
  uVar8 = this->stackLiteralBailOutRecordCount;
  if (uVar8 != 0) {
    pGVar1 = this->globalBailOutRecordTable;
    uVar18 = this->m_bailOutRecordId;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar14 = 0; uVar14 < pGVar1->length; uVar14 = uVar14 + 1) {
      pGVar15 = pGVar1->globalBailOutRecordDataRows;
      if (uVar18 <= pGVar15[uVar14].end) {
        pGVar15 = pGVar15 + uVar14;
        if (uVar18 < pGVar15->start) break;
        for (uVar16 = 0; uVar16 < uVar8; uVar16 = uVar16 + 1) {
          pSVar2 = this->stackLiteralBailOutRecord;
          uVar17 = *(uint *)&pGVar15->field_0xc;
          if (pSVar2[uVar16].regSlot == (uVar17 & 0x3fffffff)) {
            if ((uVar17 >> 0x1e & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x2ae,"(!row->isFloat)","!row->isFloat");
              if (!bVar4) goto LAB_003e2bb1;
              *puVar11 = 0;
              uVar17 = *(uint *)&pGVar15->field_0xc;
            }
            if ((int)uVar17 < 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x2af,"(!row->isInt)","!row->isInt");
              if (!bVar4) goto LAB_003e2bb1;
              *puVar11 = 0;
            }
            uVar8 = pGVar15->offset;
            if ((long)(int)uVar8 < 0) {
              aValue = Js::JavascriptCallStackLayout::GetOffset(layout,uVar8);
            }
            else {
              uVar6 = GetBailOutRegisterSaveSlotCount();
              if (uVar6 < uVar8) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,700,"((uint)offset <= GetBailOutRegisterSaveSlotCount())",
                                   "(uint)offset <= GetBailOutRegisterSaveSlotCount()");
                if (!bVar4) goto LAB_003e2bb1;
                *puVar11 = 0;
              }
              ppvVar19 = registerSaves;
              if (registerSaves == (Var *)0x0) {
                ppvVar19 = scriptContext->threadContext->bailOutRegisterSaveSpace;
              }
              RVar5 = LinearScanMD::GetRegisterFromSaveIndex(uVar8);
              if (RegTypes[RVar5] == TyFloat64) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar11 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                   ,0x2be,
                                   "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                                   ,
                                   "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                                  );
                if (!bVar4) goto LAB_003e2bb1;
                *puVar11 = 0;
              }
              aValue = ppvVar19[(long)(int)uVar8 + -1];
            }
            bVar4 = Js::DynamicObject::IsBaseDynamicObject(aValue);
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x2c1,"(Js::DynamicObject::IsBaseDynamicObject(value))",
                                 "Js::DynamicObject::IsBaseDynamicObject(value)");
              if (!bVar4) goto LAB_003e2bb1;
              *puVar11 = 0;
            }
            bVar4 = ThreadContext::IsOnStack(aValue);
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x2c2,"(ThreadContext::IsOnStack(value))",
                                 "ThreadContext::IsOnStack(value)");
              if (!bVar4) goto LAB_003e2bb1;
              *puVar11 = 0;
            }
            this_00 = Js::VarTo<Js::DynamicObject>(aValue);
            uVar7 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(this_00);
            for (uVar17 = pSVar2[uVar16].initFldCount; uVar17 < uVar7; uVar17 = uVar17 + 1) {
              Js::DynamicObject::SetSlot(this_00,-1,false,uVar17,(Var)0x0);
            }
            uVar8 = this->stackLiteralBailOutRecordCount;
          }
        }
      }
    }
  }
  if (this->localOffsetsCount != 0) {
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if (DAT_0145948a != '\0') {
      uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar8,LVar9);
      if ((bVar4) &&
         ((DAT_0145c3a8 == DAT_0145c3b0 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar4)))) {
        Output::Print(L"BailOut:   Register #%3d: Not live\n",0);
      }
    }
    for (uVar18 = 1; RVar10 = Js::FunctionBody::GetConstantCount(pFVar12), uVar18 < RVar10;
        uVar18 = uVar18 + 1) {
      if (DAT_0145948a == '\x01') {
        uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
        LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar8,LVar9);
        if ((bVar4) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar4)))) {
          Output::Print(L"BailOut:   Register #%3d: Constant table\n",(ulong)uVar18);
        }
      }
    }
    bVar4 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar12);
    if (bVar4) {
      AdjustOffsetsForDiagMode(this,layout,*(ScriptFunction **)(newInstance + 0x80));
    }
    RestoreValues(this,bailOutKind,layout,this->localOffsetsCount,(int *)0x0,0,
                  (Var *)(newInstance + 0x160),scriptContext,fromLoopBody,registerSaves,newInstance,
                  pArgumentsObject,(void *)0x0);
  }
  if ((useStartCall) && (pAVar13 = this->argOutOffsetInfo, pAVar13 != (ArgOutOffsetInfo *)0x0)) {
    uVar18 = 0;
    for (uVar14 = 0; uVar14 < pAVar13->startCallCount; uVar14 = uVar14 + 1) {
      uVar8 = pAVar13->startCallOutParamCounts[uVar14];
      Js::InterpreterStackFrame::OP_StartCall(newInstance,uVar8);
      RestoreValues(this,bailOutKind,layout,uVar8,this->argOutOffsetInfo->outParamOffsets + uVar18,
                    this->argOutOffsetInfo->argOutSymStart + uVar18,*(Var **)(newInstance + 0x28),
                    scriptContext,fromLoopBody,registerSaves,newInstance,pArgumentsObject,
                    (void *)0x0);
      uVar18 = uVar18 + uVar8;
      pAVar13 = this->argOutOffsetInfo;
    }
  }
  if ((*(JavascriptFunction **)(newInstance + 0x80) == (JavascriptFunction *)0x0) ||
     (pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80)),
     pFVar12 == (FunctionBody *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x2fc,"(newInstance->function && newInstance->function->GetFunctionBody())",
                       "newInstance->function && newInstance->function->GetFunctionBody()");
    if (!bVar4) goto LAB_003e2bb1;
    *puVar11 = 0;
  }
  if (((!fromLoopBody) &&
      (pFVar12 = Js::JavascriptFunction::GetFunctionBody
                           (*(JavascriptFunction **)(newInstance + 0x80)),
      (pFVar12->super_ParseableFunctionInfo).m_inParamCount != 0)) &&
     (*(long *)(newInstance + 0x40) == 0)) {
    *(Var *)(newInstance + 0x40) = *pArgumentsObject;
  }
  if ((bailOutReturnValue != (BailOutReturnValue *)0x0) &&
     (uVar18 = bailOutReturnValue->returnValueRegSlot, uVar18 != 0xffffffff)) {
    if (bailOutReturnValue->returnValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x306,"(bailOutReturnValue->returnValue != nullptr)",
                         "bailOutReturnValue->returnValue != nullptr");
      if (!bVar4) goto LAB_003e2bb1;
      *puVar11 = 0;
      uVar18 = bailOutReturnValue->returnValueRegSlot;
    }
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar10 = Js::FunctionBody::GetLocalsCount(pFVar12);
    if (RVar10 <= uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x307,
                         "(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar4) goto LAB_003e2bb1;
      *puVar11 = 0;
    }
    *(Var *)(newInstance + (ulong)bailOutReturnValue->returnValueRegSlot * 8 + 0x160) =
         bailOutReturnValue->returnValue;
    if (DAT_0145948a == '\x01') {
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar12);
      pFVar12 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar12);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar8,LVar9);
      if ((bVar4) &&
         ((DAT_0145c3a8 == DAT_0145c3b0 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar4)))) {
        Output::Print(L"BailOut:   Register #%3d: Return, value: 0x%p\n",
                      (ulong)bailOutReturnValue->returnValueRegSlot,bailOutReturnValue->returnValue)
        ;
      }
    }
  }
  if (this->branchValueRegSlot != 0xffffffff) {
    if ((branchValue == (Var)0x0) || (bVar4 = Js::VarIs<Js::JavascriptBoolean>(branchValue), !bVar4)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x311,"(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue))",
                         "branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue)");
      if (!bVar4) goto LAB_003e2bb1;
      *puVar11 = 0;
    }
    uVar18 = this->branchValueRegSlot;
    pFVar12 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar10 = Js::FunctionBody::GetLocalsCount(pFVar12);
    if (RVar10 <= uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x312,
                         "(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar4) {
LAB_003e2bb1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    *(Var *)(newInstance + (ulong)this->branchValueRegSlot * 8 + 0x160) = branchValue;
  }
  ppvVar19 = scriptContext->threadContext->bailOutRegisterSaveSpace;
  uVar8 = GetBailOutRegisterSaveSlotCount();
  memset(ppvVar19,0,(ulong)uVar8 << 3);
  scriptContext->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::InterpreterStackFrame * newInstance,
    Js::ScriptContext * scriptContext, bool fromLoopBody, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * returnAddress, bool useStartCall /* = true */, void * argoutRestoreAddress) const
{
    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(scriptContext, returnAddress);

    if (this->stackLiteralBailOutRecordCount)
    {
        // Null out the field on the stack literal that hasn't fully initialized yet.

        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow  *row)
        {
            for (uint i = 0; i < this->stackLiteralBailOutRecordCount; i++)
            {
                BailOutRecord::StackLiteralBailOutRecord& record = this->stackLiteralBailOutRecord[i];

                if (record.regSlot == row->regSlot)
                {
                    // Partially initialized stack literal shouldn't be type specialized yet.
                    Assert(!row->isFloat);
                    Assert(!row->isInt);

                    int offset = row->offset;
                    Js::Var value;
                    if (offset < 0)
                    {
                        // Stack offset
                        value = layout->GetOffset(offset);
                    }
                    else
                    {
                        // The value is in register
                        // Index is one based, so subtract one
                        Assert((uint)offset <= GetBailOutRegisterSaveSlotCount());
                        Js::Var * registerSaveSpace = registerSaves ? registerSaves : (Js::Var *)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace();
                        Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                        value = registerSaveSpace[offset - 1];
                    }
                    Assert(Js::DynamicObject::IsBaseDynamicObject(value));
                    Assert(ThreadContext::IsOnStack(value));

                    Js::DynamicObject * obj = Js::VarTo<Js::DynamicObject>(value);
                    uint propertyCount = obj->GetPropertyCount();
                    for (uint j = record.initFldCount; j < propertyCount; j++)
                    {
                        obj->SetSlot(SetSlotArgumentsRoot(Js::Constants::NoProperty, false, j, nullptr));
                    }
                }
            }
        });
    }

    if (this->localOffsetsCount)
    {
        Js::FunctionBody* functionBody = newInstance->function->GetFunctionBody();
#if ENABLE_DEBUG_CONFIG_OPTIONS
        BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Not live\n"), 0);

        for (uint i = 1; i < functionBody->GetConstantCount(); i++)
        {
            BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Constant table\n"), i);
        }
#endif

        if (functionBody->IsInDebugMode())
        {
            this->AdjustOffsetsForDiagMode(layout, newInstance->GetJavascriptFunction());
        }

        this->RestoreValues(bailOutKind, layout, this->localOffsetsCount,
            nullptr, 0, newInstance->m_localSlots, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject);
    }

    if (useStartCall && this->argOutOffsetInfo)
    {
        uint outParamSlot = 0;
        void * argRestoreAddr = nullptr;
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
#ifdef _M_IX86
            if (argoutRestoreAddress)
            {
                argRestoreAddr = (void*)((char*)argoutRestoreAddress + (this->startCallArgRestoreAdjustCounts[i] * MachPtr));
            }
#endif
            newInstance->OP_StartCall(startCallOutParamCount);
            this->RestoreValues(bailOutKind, layout, startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot],
                this->argOutOffsetInfo->argOutSymStart + outParamSlot, newInstance->m_outParams,
                scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject, argRestoreAddr);
            outParamSlot += startCallOutParamCount;
        }
    }

    // If we're not in a loop body, then the arguments object is not on the local frame.
    // If the RestoreValues created an arguments object for us, then it's already on the interpreter instance.
    // Otherwise, we need to propagate the object from the jitted frame to the interpreter.
    Assert(newInstance->function && newInstance->function->GetFunctionBody());
    bool hasArgumentSlot =      // Be consistent with Func::HasArgumentSlot.
        !fromLoopBody && newInstance->function->GetFunctionBody()->GetInParamsCount() != 0;
    if (hasArgumentSlot && newInstance->m_arguments == nullptr)
    {
        newInstance->m_arguments = *pArgumentsObject;
    }

    if (bailOutReturnValue != nullptr && bailOutReturnValue->returnValueRegSlot != Js::Constants::NoRegister)
    {
        Assert(bailOutReturnValue->returnValue != nullptr);
        Assert(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[bailOutReturnValue->returnValueRegSlot] = bailOutReturnValue->returnValue;

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Register #%3d: Return, value: 0x%p\n"),
            bailOutReturnValue->returnValueRegSlot, bailOutReturnValue->returnValue);
    }

    if (branchValueRegSlot != Js::Constants::NoRegister)
    {
        // Used when a t1 = CmCC is optimize to BrCC, and the branch bails out. T1 needs to be restored
        Assert(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue));
        Assert(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[branchValueRegSlot] = branchValue;
    }

#if DBG
    // Clear the register save area for the next bailout
    memset((void*)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace(), 0, GetBailOutRegisterSaveSlotCount() * sizeof(Js::Var));
#endif
}